

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O1

int frame_worker_hook(void *arg1,void *arg2)

{
  int iVar1;
  uint8_t *data;
  uint8_t *local_18;
  
  local_18 = *(uint8_t **)((long)arg1 + 8);
  iVar1 = av1_receive_compressed_data(*arg1,*(size_t *)((long)arg1 + 0x18),&local_18);
  *(uint8_t **)((long)arg1 + 0x10) = local_18;
  if (iVar1 != 0) {
    *(undefined4 *)(*arg1 + 0x58d90) = 1;
  }
  return (int)(iVar1 == 0);
}

Assistant:

static int frame_worker_hook(void *arg1, void *arg2) {
  FrameWorkerData *const frame_worker_data = (FrameWorkerData *)arg1;
  const uint8_t *data = frame_worker_data->data;
  (void)arg2;

  int result = av1_receive_compressed_data(frame_worker_data->pbi,
                                           frame_worker_data->data_size, &data);
  frame_worker_data->data_end = data;

  if (result != 0) {
    // Check decode result in serial decode.
    frame_worker_data->pbi->need_resync = 1;
  }
  return !result;
}